

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_bind_text64(sqlite3_stmt *pStmt,int i,char *zData,sqlite3_uint64 nData,
                       _func_void_void_ptr *xDel,uchar enc)

{
  int iVar1;
  u8 encoding;
  
  if (nData >> 0x1f != 0) {
    if ((code *)0x1 < xDel + 1) {
      (*xDel)(zData);
    }
    return 0x12;
  }
  encoding = '\x02';
  if (enc != '\x04') {
    encoding = enc;
  }
  iVar1 = bindText(pStmt,i,zData,(int)nData,xDel,encoding);
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_text64( 
  sqlite3_stmt *pStmt, 
  int i, 
  const char *zData, 
  sqlite3_uint64 nData, 
  void (*xDel)(void*),
  unsigned char enc
){
  assert( xDel!=SQLITE_DYNAMIC );
  if( nData>0x7fffffff ){
    return invokeValueDestructor(zData, xDel, 0);
  }else{
    if( enc==SQLITE_UTF16 ) enc = SQLITE_UTF16NATIVE;
    return bindText(pStmt, i, zData, (int)nData, xDel, enc);
  }
}